

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
* __thiscall
cmGlobalGenerator::GenerateBuildCommand
          (vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
           *__return_storage_ptr__,cmGlobalGenerator *this,string *param_1,string *param_2,
          string *param_3,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_4,string *param_5,bool param_6,int param_7,bool param_8,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_9)

{
  initializer_list<cmGlobalGenerator::GeneratedMakeCommand> __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  allocator<cmGlobalGenerator::GeneratedMakeCommand> local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  size_type local_78;
  undefined1 local_60 [8];
  GeneratedMakeCommand makeCommand;
  bool param_8_local;
  bool param_6_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *param_4_local;
  string *param_3_local;
  string *param_2_local;
  string *param_1_local;
  cmGlobalGenerator *this_local;
  
  makeCommand.super_GeneratedMakeCommand._31_1_ = param_6;
  makeCommand.super_GeneratedMakeCommand._30_1_ = param_8;
  GeneratedMakeCommand::GeneratedMakeCommand((GeneratedMakeCommand *)local_60);
  detail::GeneratedMakeCommand::Add<char_const(&)[56]>
            ((GeneratedMakeCommand *)local_60,
             (char (*) [56])"cmGlobalGenerator::GenerateBuildCommand not implemented");
  GeneratedMakeCommand::GeneratedMakeCommand
            ((GeneratedMakeCommand *)&local_a0,(GeneratedMakeCommand *)local_60);
  local_78 = 1;
  local_80 = &local_a0;
  std::allocator<cmGlobalGenerator::GeneratedMakeCommand>::allocator(&local_a1);
  __l._M_len = local_78;
  __l._M_array = (iterator)local_80;
  std::
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  ::vector(__return_storage_ptr__,__l,&local_a1);
  std::allocator<cmGlobalGenerator::GeneratedMakeCommand>::~allocator(&local_a1);
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80;
  do {
    local_f0 = local_f0 + -1;
    GeneratedMakeCommand::~GeneratedMakeCommand((GeneratedMakeCommand *)local_f0);
  } while (local_f0 != &local_a0);
  GeneratedMakeCommand::~GeneratedMakeCommand((GeneratedMakeCommand *)local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmGlobalGenerator::GeneratedMakeCommand>
cmGlobalGenerator::GenerateBuildCommand(
  const std::string& /*unused*/, const std::string& /*unused*/,
  const std::string& /*unused*/, std::vector<std::string> const& /*unused*/,
  const std::string& /*unused*/, bool /*unused*/, int /*unused*/,
  bool /*unused*/, std::vector<std::string> const& /*unused*/)
{
  GeneratedMakeCommand makeCommand;
  makeCommand.Add("cmGlobalGenerator::GenerateBuildCommand not implemented");
  return { std::move(makeCommand) };
}